

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kex_agree_hostkey(LIBSSH2_SESSION *session,unsigned_long kex_flags,uchar *hostkey,
                     unsigned_long hostkey_len)

{
  char *pcVar1;
  uchar *puVar2;
  LIBSSH2_HOSTKEY_METHOD *pLVar3;
  size_t needle_len;
  bool bVar4;
  uchar *local_70;
  size_t local_68;
  LIBSSH2_HOSTKEY_METHOD *method;
  size_t method_len;
  uchar *p;
  uchar *s;
  LIBSSH2_HOSTKEY_METHOD **hostkeyp;
  unsigned_long hostkey_len_local;
  uchar *hostkey_local;
  unsigned_long kex_flags_local;
  LIBSSH2_SESSION *session_local;
  
  s = (uchar *)libssh2_hostkey_methods();
  if (session->hostkey_prefs == (char *)0x0) {
    while( true ) {
      bVar4 = false;
      if ((s != (uchar *)0x0) && (bVar4 = false, *(long *)s != 0)) {
        bVar4 = **(long **)s != 0;
      }
      if (!bVar4) break;
      puVar2 = (uchar *)**(undefined8 **)s;
      needle_len = strlen((char *)**(undefined8 **)s);
      puVar2 = kex_agree_instr(hostkey,hostkey_len,puVar2,needle_len);
      if (((puVar2 != (uchar *)0x0) &&
          (((kex_flags & 1) == 0 || (*(long *)(*(long *)s + 0x38) != 0)))) &&
         (((kex_flags & 2) == 0 || (*(long *)(*(long *)s + 0x28) != 0)))) {
        session->hostkey = *(LIBSSH2_HOSTKEY_METHOD **)s;
        return 0;
      }
      s = s + 8;
    }
    return -1;
  }
  p = (uchar *)session->hostkey_prefs;
  do {
    bVar4 = false;
    if (p != (uchar *)0x0) {
      bVar4 = *p != '\0';
    }
    if (!bVar4) {
      return -1;
    }
    pcVar1 = strchr((char *)p,0x2c);
    if (pcVar1 == (char *)0x0) {
      local_68 = strlen((char *)p);
    }
    else {
      local_68 = (long)pcVar1 - (long)p;
    }
    puVar2 = kex_agree_instr(hostkey,hostkey_len,p,local_68);
    if (puVar2 != (uchar *)0x0) {
      pLVar3 = (LIBSSH2_HOSTKEY_METHOD *)
               kex_get_method_by_name((char *)p,local_68,(LIBSSH2_COMMON_METHOD **)s);
      if (pLVar3 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
        return -1;
      }
      if ((((kex_flags & 1) == 0) ||
          (pLVar3->encrypt !=
           (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_ptr_size_t_ptr_uchar_ptr_size_t_void_ptr_ptr *)
           0x0)) &&
         (((kex_flags & 2) == 0 ||
          (pLVar3->sig_verify !=
           (_func_int_LIBSSH2_SESSION_ptr_uchar_ptr_size_t_uchar_ptr_size_t_void_ptr_ptr *)0x0)))) {
        session->hostkey = pLVar3;
        return 0;
      }
    }
    if (pcVar1 == (char *)0x0) {
      local_70 = (uchar *)0x0;
    }
    else {
      local_70 = (uchar *)(pcVar1 + 1);
    }
    p = local_70;
  } while( true );
}

Assistant:

static int kex_agree_hostkey(LIBSSH2_SESSION * session,
                             unsigned long kex_flags,
                             unsigned char *hostkey, unsigned long hostkey_len)
{
    const LIBSSH2_HOSTKEY_METHOD **hostkeyp = libssh2_hostkey_methods();
    unsigned char *s;

    if (session->hostkey_prefs) {
        s = (unsigned char *) session->hostkey_prefs;

        while (s && *s) {
            unsigned char *p = (unsigned char *) strchr((char *) s, ',');
            size_t method_len = (p ? (size_t)(p - s) : strlen((char *) s));
            if (kex_agree_instr(hostkey, hostkey_len, s, method_len)) {
                const LIBSSH2_HOSTKEY_METHOD *method =
                    (const LIBSSH2_HOSTKEY_METHOD *)
                    kex_get_method_by_name((char *) s, method_len,
                                           (const LIBSSH2_COMMON_METHOD **)
                                           hostkeyp);

                if (!method) {
                    /* Invalid method -- Should never be reached */
                    return -1;
                }

                /* So far so good, but does it suit our purposes? (Encrypting
                   vs Signing) */
                if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_ENC_HOSTKEY) ==
                     0) || (method->encrypt)) {
                    /* Either this hostkey can do encryption or this kex just
                       doesn't require it */
                    if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_SIGN_HOSTKEY)
                         == 0) || (method->sig_verify)) {
                        /* Either this hostkey can do signing or this kex just
                           doesn't require it */
                        session->hostkey = method;
                        return 0;
                    }
                }
            }

            s = p ? p + 1 : NULL;
        }
        return -1;
    }

    while (hostkeyp && (*hostkeyp) && (*hostkeyp)->name) {
        s = kex_agree_instr(hostkey, hostkey_len,
                            (unsigned char *) (*hostkeyp)->name,
                            strlen((*hostkeyp)->name));
        if (s) {
            /* So far so good, but does it suit our purposes? (Encrypting vs
               Signing) */
            if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_ENC_HOSTKEY) == 0) ||
                ((*hostkeyp)->encrypt)) {
                /* Either this hostkey can do encryption or this kex just
                   doesn't require it */
                if (((kex_flags & LIBSSH2_KEX_METHOD_FLAG_REQ_SIGN_HOSTKEY) ==
                     0) || ((*hostkeyp)->sig_verify)) {
                    /* Either this hostkey can do signing or this kex just
                       doesn't require it */
                    session->hostkey = *hostkeyp;
                    return 0;
                }
            }
        }
        hostkeyp++;
    }

    return -1;
}